

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_overlay.cpp
# Opt level: O3

void __thiscall r_exec::InputLessPGMOverlay::reset(InputLessPGMOverlay *this)

{
  pointer puVar1;
  pointer pAVar2;
  pointer pAVar3;
  pointer this_00;
  
  Overlay::reset(&this->super_Overlay);
  patch_tpl_args(this);
  puVar1 = (this->super_Overlay).patch_indices.
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->super_Overlay).patch_indices.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->super_Overlay).patch_indices.
    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  (this->super_Overlay).value_commit_index = 0;
  pAVar2 = (this->super_Overlay).values.m_vector.
           super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
           super__Vector_impl_data._M_start;
  pAVar3 = (this->super_Overlay).values.m_vector.
           super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_00 = pAVar2;
  if (pAVar3 != pAVar2) {
    do {
      r_code::Atom::~Atom(this_00);
      this_00 = this_00 + 4;
    } while (this_00 != pAVar3);
    (this->super_Overlay).values.m_vector.
    super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.super__Vector_impl_data.
    _M_finish = pAVar2;
  }
  std::vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>::clear
            (&this->productions);
  return;
}

Assistant:

inline void InputLessPGMOverlay::reset()
{
    Overlay::reset();
    patch_tpl_args();
    patch_indices.clear();
    value_commit_index = 0;
    values.as_std()->clear();
    productions.clear();
}